

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_6acc::VECTOR_FLATTEN_DIM_1_Test::TestBody(VECTOR_FLATTEN_DIM_1_Test *this)

{
  initializer_list<int> __l;
  bool bVar1;
  char *pcVar2;
  reference pvVar3;
  AssertHelper local_108;
  Message local_100;
  int local_f4;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_2;
  Message local_d8;
  int local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_1;
  Message local_b0;
  int local_a4;
  size_type local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  undefined1 local_70 [8];
  vector<int,_std::allocator<int>_> res;
  allocator<int> local_45;
  int local_44 [3];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  type v;
  VECTOR_FLATTEN_DIM_1_Test *this_local;
  
  local_44[0] = 1;
  local_44[1] = 2;
  local_44[2] = 3;
  local_38 = local_44;
  local_30 = 3;
  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)this;
  std::allocator<int>::allocator(&local_45);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,__l,&local_45);
  std::allocator<int>::~allocator(&local_45);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar.message_,
             (vector<int,_std::allocator<int>_> *)local_28);
  dnet::data_types::vec_flater<int,_1U>::flatten
            ((output_type *)local_70,(input_type *)&gtest_ar.message_);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar.message_);
  local_a0 = std::vector<int,_std::allocator<int>_>::size
                       ((vector<int,_std::allocator<int>_> *)local_70);
  local_a4 = 3;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_98,"res.size()","3",&local_a0,&local_a4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x21,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_70,2);
  local_cc = 3;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_c8,"res[2]","3",pvVar3,&local_cc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x22,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_70,1);
  local_f4 = 2;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_f0,"res[1]","2",pvVar3,&local_f4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x23,pcVar2);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_70);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return;
}

Assistant:

TEST(VECTOR_FLATTEN, DIM_1) {
        vector_dim<int, 1>::type v = {1,2,3};
        vector<int> res = vec_flater<int, 1>::flatten(v);
        EXPECT_EQ(res.size(), 3);
        EXPECT_EQ(res[2], 3);
        EXPECT_EQ(res[1], 2);
    }